

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

edata_t * extent_try_coalesce_impl
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *edata,
                    _Bool *coalesced)

{
  bool bVar1;
  _Bool _Var2;
  edata_t *peVar3;
  
  do {
    bVar1 = false;
    peVar3 = duckdb_je_emap_try_acquire_edata_neighbor
                       (tsdn,pac->emap,edata,EXTENT_PAI_PAC,ecache->state,true);
    if (peVar3 != (edata_t *)0x0) {
      _Var2 = extent_coalesce(tsdn,pac,ehooks,ecache,edata,peVar3,true);
      if (_Var2) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        _Var2 = true;
        peVar3 = edata;
        if (ecache->delay_coalesce != false) goto LAB_01176588;
      }
    }
    peVar3 = duckdb_je_emap_try_acquire_edata_neighbor
                       (tsdn,pac->emap,edata,EXTENT_PAI_PAC,ecache->state,false);
    if ((peVar3 != (edata_t *)0x0) &&
       (_Var2 = extent_coalesce(tsdn,pac,ehooks,ecache,edata,peVar3,false), !_Var2)) {
      bVar1 = true;
      _Var2 = true;
      edata = peVar3;
      if (ecache->delay_coalesce != false) goto LAB_01176588;
    }
  } while (bVar1);
  peVar3 = edata;
  if (ecache->delay_coalesce == true) {
    _Var2 = false;
LAB_01176588:
    *coalesced = _Var2;
  }
  return peVar3;
}

Assistant:

static edata_t *
extent_try_coalesce_impl(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    ecache_t *ecache, edata_t *edata, bool *coalesced) {
	assert(!edata_guarded_get(edata));
	assert(coalesced != NULL);
	/*
	 * We avoid checking / locking inactive neighbors for large size
	 * classes, since they are eagerly coalesced on deallocation which can
	 * cause lock contention.
	 */
	/*
	 * Continue attempting to coalesce until failure, to protect against
	 * races with other threads that are thwarted by this one.
	 */
	bool again;
	do {
		again = false;

		/* Try to coalesce forward. */
		edata_t *next = emap_try_acquire_edata_neighbor(tsdn, pac->emap,
		    edata, EXTENT_PAI_PAC, ecache->state, /* forward */ true);
		if (next != NULL) {
			if (!extent_coalesce(tsdn, pac, ehooks, ecache, edata,
			    next, true)) {
				if (ecache->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return edata;
				}
				again = true;
			}
		}

		/* Try to coalesce backward. */
		edata_t *prev = emap_try_acquire_edata_neighbor(tsdn, pac->emap,
		    edata, EXTENT_PAI_PAC, ecache->state, /* forward */ false);
		if (prev != NULL) {
			if (!extent_coalesce(tsdn, pac, ehooks, ecache, edata,
			    prev, false)) {
				edata = prev;
				if (ecache->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return edata;
				}
				again = true;
			}
		}
	} while (again);

	if (ecache->delay_coalesce) {
		*coalesced = false;
	}
	return edata;
}